

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_interpolate_node(REF_GRID ref_grid,REF_INT node)

{
  REF_INTERP ref_interp;
  REF_MPI pRVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  REF_DBL *pRVar7;
  double *pdVar8;
  char *pcVar9;
  long lVar10;
  REF_DBL log_m [6];
  REF_DBL bary [4];
  REF_INT nodes [27];
  REF_DBL log_parent_m [4] [6];
  REF_DBL local_1b8 [6];
  REF_DBL local_188 [4];
  REF_INT local_168 [28];
  REF_DBL local_f8 [25];
  
  ref_interp = ref_grid->interp;
  if (ref_interp != (REF_INTERP)0x0) {
    if (ref_interp->continuously == 0) {
      ref_interp->cell[node] = -1;
    }
    else {
      pRVar1 = ref_grid->mpi;
      ref_node = ref_interp->from_grid->node;
      ref_cell = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
      RVar2 = ref_interp_locate_node(ref_interp,node);
      if (RVar2 != 0) {
        return RVar2;
      }
      if (ref_interp->cell[node] != -1) {
        if (pRVar1->id != ref_interp->part[node]) {
          return 0;
        }
        uVar3 = ref_cell_nodes(ref_cell,ref_interp->cell[node],local_168);
        if (uVar3 == 0) {
          uVar3 = ref_node_clip_bary4(ref_interp->bary + node * 4,local_188);
          if (uVar3 == 0) {
            pRVar7 = local_f8;
            lVar10 = 0;
            do {
              uVar3 = ref_cell->node_per;
              if ((int)uVar3 <= lVar10) {
                for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                  local_1b8[lVar10] = 0.0;
                }
                uVar4 = 0;
                uVar5 = (ulong)uVar3;
                if ((int)uVar3 < 1) {
                  uVar5 = uVar4;
                }
                pRVar7 = local_f8;
                for (; uVar4 != 6; uVar4 = uVar4 + 1) {
                  pdVar8 = local_188;
                  for (lVar10 = 0; uVar5 * 6 - lVar10 != 0; lVar10 = lVar10 + 6) {
                    local_1b8[uVar4] = *pdVar8 * pRVar7[lVar10] + local_1b8[uVar4];
                    pdVar8 = pdVar8 + 1;
                  }
                  pRVar7 = pRVar7 + 1;
                }
                uVar3 = ref_node_metric_set_log(ref_grid->node,node,local_1b8);
                if (uVar3 == 0) {
                  return 0;
                }
                pcVar9 = "set interp log met";
                uVar6 = 0x204;
                goto LAB_001b4ef9;
              }
              uVar3 = ref_node_metric_get_log(ref_node,local_168[lVar10],pRVar7);
              lVar10 = lVar10 + 1;
              pRVar7 = pRVar7 + 6;
            } while (uVar3 == 0);
            pcVar9 = "log(parentM)";
            uVar6 = 0x1fc;
          }
          else {
            pcVar9 = "clip";
            uVar6 = 0x1f9;
          }
        }
        else {
          pcVar9 = "node needs to be localized";
          uVar6 = 0x1f8;
        }
LAB_001b4ef9:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar6,"ref_metric_interpolate_node",(ulong)uVar3,pcVar9);
        return uVar3;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate_node(REF_GRID ref_grid,
                                               REF_INT node) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE from_node;
  REF_CELL from_cell;
  REF_DBL log_parent_m[4][6], log_m[6], bary[4];
  REF_INT ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == ref_grid_interp(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_interp = ref_grid_interp(ref_grid);
  from_grid = ref_interp_from_grid(ref_interp);
  from_node = ref_grid_node(from_grid);
  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (!ref_interp_continuously(ref_interp)) {
    ref_interp_cell(ref_interp, node) = REF_EMPTY; /* mark moved */
    return REF_SUCCESS;
  }

  RAISE(ref_interp_locate_node(ref_interp, node));

  /* location unsuccessful */
  if (REF_EMPTY == ref_interp_cell(ref_interp, node) ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;
  RSS(ref_cell_nodes(from_cell, ref_interp_cell(ref_interp, node), nodes),
      "node needs to be localized");
  RSS(ref_node_clip_bary4(&ref_interp_bary(ref_interp, 0, node), bary), "clip");
  for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++)
    RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
        "log(parentM)");
  for (im = 0; im < 6; im++) log_m[im] = 0.0;
  for (im = 0; im < 6; im++) {
    for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
      log_m[im] += bary[ibary] * log_parent_m[ibary][im];
    }
  }
  RSS(ref_node_metric_set_log(ref_grid_node(ref_grid), node, log_m),
      "set interp log met");

  return REF_SUCCESS;
}